

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O3

int FinalizeSkipProba(VP8Encoder *enc)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar6 = (long)enc->mb_h_ * (long)enc->mb_w_;
  if ((int)uVar6 == 0) {
    (enc->proba_).skip_proba_ = 0xff;
    (enc->proba_).use_skip_proba_ = 0;
    iVar5 = 0x100;
  }
  else {
    iVar1 = (enc->proba_).nb_skip_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (uVar6 - (long)iVar1) * 0xff;
    (enc->proba_).skip_proba_ = SUB161(auVar3 / auVar2,0);
    uVar4 = SUB164(auVar3 / auVar2,0);
    iVar5 = 0x100;
    bVar7 = (uVar4 & 0xfe) < 0xfa;
    (enc->proba_).use_skip_proba_ = (uint)bVar7;
    if (bVar7) {
      uVar4 = uVar4 & 0xff;
      iVar5 = (uint)VP8EntropyCost[uVar4 ^ 0xff] * iVar1 +
              (uint)VP8EntropyCost[uVar4] * ((int)uVar6 - iVar1) + 0x900;
    }
  }
  return iVar5;
}

Assistant:

static int FinalizeSkipProba(VP8Encoder* const enc) {
  VP8EncProba* const proba = &enc->proba_;
  const int nb_mbs = enc->mb_w_ * enc->mb_h_;
  const int nb_events = proba->nb_skip_;
  int size;
  proba->skip_proba_ = CalcSkipProba(nb_events, nb_mbs);
  proba->use_skip_proba_ = (proba->skip_proba_ < SKIP_PROBA_THRESHOLD);
  size = 256;   // 'use_skip_proba' bit
  if (proba->use_skip_proba_) {
    size +=  nb_events * VP8BitCost(1, proba->skip_proba_)
         + (nb_mbs - nb_events) * VP8BitCost(0, proba->skip_proba_);
    size += 8 * 256;   // cost of signaling the skip_proba_ itself.
  }
  return size;
}